

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O3

uint64_t DecompressAmount(uint64_t x)

{
  uint64_t uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  if (x == 0) {
    uVar1 = 0;
  }
  else {
    uVar4 = x - 1;
    uVar3 = uVar4 % 10;
    if (uVar3 < 9) {
      uVar1 = (uVar4 / 10) % 9 + (uVar4 / 0x5a) * 10 + 1;
      if (uVar3 == 0) goto LAB_00d30b53;
    }
    else {
      uVar1 = uVar4 / 10 + 1;
    }
    do {
      uVar1 = uVar1 * 10;
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
LAB_00d30b53:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

uint64_t DecompressAmount(uint64_t x)
{
    // x = 0  OR  x = 1+10*(9*n + d - 1) + e  OR  x = 1+10*(n - 1) + 9
    if (x == 0)
        return 0;
    x--;
    // x = 10*(9*n + d - 1) + e
    int e = x % 10;
    x /= 10;
    uint64_t n = 0;
    if (e < 9) {
        // x = 9*n + d - 1
        int d = (x % 9) + 1;
        x /= 9;
        // x = n
        n = x*10 + d;
    } else {
        n = x+1;
    }
    while (e) {
        n *= 10;
        e--;
    }
    return n;
}